

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void sqlite3FkActions(Parse *pParse,Table *pTab,ExprList *pChanges,int regOld,int *aChange,
                     int bChngRowid)

{
  sColMap *psVar1;
  u64 n;
  u8 uVar2;
  char cVar3;
  u8 uVar4;
  undefined1 uVar5;
  int iVar6;
  HashElem *pHVar7;
  sColMap *psVar8;
  Expr *pEVar9;
  Expr *pEVar10;
  Expr *pRight;
  char *pcVar11;
  ExprList *pEList;
  SrcList *pSrc;
  Trigger *p;
  Schema *pSVar12;
  Select *pSVar13;
  uint uVar14;
  FKey *p_00;
  sqlite3 *pParse_00;
  long lVar15;
  sqlite3 *db;
  TriggerStep *pTVar16;
  uint h;
  int *aiCol;
  Token tNew;
  Index *pIdx;
  Token tToCol;
  Token tFromCol;
  Expr *local_100;
  Select *local_f0;
  ExprList *local_e8;
  Expr *local_e0;
  Token local_c8;
  sqlite3 *local_b0;
  int *local_a8;
  int local_9c;
  Token local_98;
  int *local_80;
  ulong local_78;
  Index *local_70;
  ulong local_68;
  char *local_60;
  FKey *local_58;
  Token local_50;
  Token local_40;
  
  if ((((pParse->db->flags & 0x80000) != 0) &&
      (local_9c = regOld,
      pHVar7 = findElementWithHash(&pTab->pSchema->fkeyHash,pTab->zName,(uint *)&local_c8),
      pHVar7 != (HashElem *)0x0)) && (p_00 = (FKey *)pHVar7->data, p_00 != (FKey *)0x0)) {
    local_78 = (ulong)(pChanges != (ExprList *)0x0);
    local_80 = aChange;
    do {
      if ((aChange == (int *)0x0) ||
         (iVar6 = fkParentIsModified(pTab,p_00,aChange,bChngRowid), iVar6 != 0)) {
        uVar2 = p_00->aAction[local_78];
        p = p_00->apTrigger[local_78];
        if (p == (Trigger *)0x0 && uVar2 != '\0') {
          db = pParse->db;
          local_70 = (Index *)0x0;
          local_a8 = (int *)0x0;
          iVar6 = sqlite3FkLocateIndex(pParse,pTab,p_00,&local_70,&local_a8);
          if (iVar6 == 0) {
            if (p_00->nCol < 1) {
              local_100 = (Expr *)0x0;
              local_e8 = (ExprList *)0x0;
              local_e0 = (Expr *)0x0;
            }
            else {
              psVar1 = p_00->aCol;
              lVar15 = 0;
              local_e0 = (Expr *)0x0;
              local_e8 = (ExprList *)0x0;
              local_100 = (Expr *)0x0;
              local_b0 = db;
              local_58 = p_00;
              do {
                local_c8.z = "old";
                local_c8.n = 3;
                local_c8._12_4_ = 0;
                psVar8 = (sColMap *)(local_a8 + lVar15);
                if (local_a8 == (int *)0x0) {
                  psVar8 = psVar1;
                }
                local_98.z = "new";
                local_98.n = 3;
                local_98._12_4_ = 0;
                local_50.z = "oid";
                if (local_70 != (Index *)0x0) {
                  local_50.z = pTab->aCol[local_70->aiColumn[lVar15]].zName;
                }
                iVar6 = psVar8->iFrom;
                local_40.z = p_00->pFrom->aCol[iVar6].zName;
                local_40.n = 0;
                local_50.n = 0;
                if (local_50.z != (char *)0x0) {
                  local_50.n = 0xffffffff;
                  pcVar11 = local_50.z;
                  do {
                    local_50.n = local_50.n + 1;
                    cVar3 = *pcVar11;
                    pcVar11 = pcVar11 + 1;
                  } while (cVar3 != '\0');
                  local_50.n = local_50.n & 0x3fffffff;
                }
                if (local_40.z != (char *)0x0) {
                  local_40.n = 0xffffffff;
                  pcVar11 = local_40.z;
                  do {
                    local_40.n = local_40.n + 1;
                    cVar3 = *pcVar11;
                    pcVar11 = pcVar11 + 1;
                  } while (cVar3 != '\0');
                  local_40.n = local_40.n & 0x3fffffff;
                }
                pEVar9 = sqlite3PExpr(pParse,0x1b,(Expr *)0x0,(Expr *)0x0,&local_c8);
                pEVar10 = sqlite3PExpr(pParse,0x1b,(Expr *)0x0,(Expr *)0x0,&local_50);
                pEVar9 = sqlite3PExpr(pParse,0x7a,pEVar9,pEVar10,(Token *)0x0);
                pEVar10 = sqlite3PExpr(pParse,0x1b,(Expr *)0x0,(Expr *)0x0,&local_40);
                pEVar9 = sqlite3PExpr(pParse,0x4f,pEVar9,pEVar10,(Token *)0x0);
                db = local_b0;
                local_100 = sqlite3ExprAnd(local_b0,local_100,pEVar9);
                if (pChanges != (ExprList *)0x0) {
                  pEVar9 = sqlite3PExpr(pParse,0x1b,(Expr *)0x0,(Expr *)0x0,&local_c8);
                  pEVar10 = sqlite3PExpr(pParse,0x1b,(Expr *)0x0,(Expr *)0x0,&local_50);
                  pEVar9 = sqlite3PExpr(pParse,0x7a,pEVar9,pEVar10,(Token *)0x0);
                  pEVar10 = sqlite3PExpr(pParse,0x1b,(Expr *)0x0,(Expr *)0x0,&local_98);
                  pRight = sqlite3PExpr(pParse,0x1b,(Expr *)0x0,(Expr *)0x0,&local_50);
                  db = local_b0;
                  pEVar10 = sqlite3PExpr(pParse,0x7a,pEVar10,pRight,(Token *)0x0);
                  pEVar9 = sqlite3PExpr(pParse,0x49,pEVar9,pEVar10,(Token *)0x0);
                  local_e0 = sqlite3ExprAnd(db,local_e0,pEVar9);
                }
                p_00 = local_58;
                if ((uVar2 != '\t' || pChanges != (ExprList *)0x0) && uVar2 != '\x06') {
                  if (uVar2 == '\b') {
                    pEVar9 = local_58->pFrom->aCol[iVar6].pDflt;
                    if (pEVar9 == (Expr *)0x0) goto LAB_001684e9;
                    pEVar9 = exprDup(db,pEVar9,0,(u8 **)0x0);
                  }
                  else {
                    if (uVar2 == '\t') {
                      pEVar9 = sqlite3PExpr(pParse,0x1b,(Expr *)0x0,(Expr *)0x0,&local_98);
                      pEVar10 = sqlite3PExpr(pParse,0x1b,(Expr *)0x0,(Expr *)0x0,&local_50);
                      iVar6 = 0x7a;
                      db = local_b0;
                    }
                    else {
LAB_001684e9:
                      iVar6 = 0x65;
                      pEVar9 = (Expr *)0x0;
                      pEVar10 = (Expr *)0x0;
                    }
                    pEVar9 = sqlite3PExpr(pParse,iVar6,pEVar9,pEVar10,(Token *)0x0);
                  }
                  local_e8 = sqlite3ExprListAppend((Parse *)pParse->db,local_e8,pEVar9);
                  sqlite3ExprListSetName(pParse,local_e8,&local_40,0);
                }
                lVar15 = lVar15 + 1;
              } while (lVar15 < p_00->nCol);
            }
            sqlite3DbFree(db,local_a8);
            local_60 = p_00->pFrom->zName;
            if (local_60 == (char *)0x0) {
              uVar14 = 0;
            }
            else {
              uVar14 = 0xffffffff;
              pcVar11 = local_60;
              do {
                uVar14 = uVar14 + 1;
                cVar3 = *pcVar11;
                pcVar11 = pcVar11 + 1;
              } while (cVar3 != '\0');
              uVar14 = uVar14 & 0x3fffffff;
            }
            if (uVar2 == '\x06') {
              local_98.n = uVar14;
              local_c8.z = "FOREIGN KEY constraint failed";
              local_c8.n = 0x1d;
              local_98.z = local_60;
              pEVar9 = sqlite3ExprAlloc(db,0x39,&local_c8,0);
              if (pEVar9 == (Expr *)0x0) {
                pParse_00 = pParse->db;
                pEVar9 = (Expr *)0x0;
              }
              else {
                pEVar9->affinity = '\x02';
                pParse_00 = pParse->db;
              }
              pEList = sqlite3ExprListAppend((Parse *)pParse_00,(ExprList *)0x0,pEVar9);
              pSrc = sqlite3SrcListAppend(db,(SrcList *)0x0,&local_98,(Token *)0x0);
              local_f0 = sqlite3SelectNew(pParse,pEList,pSrc,local_100,(ExprList *)0x0,(Expr *)0x0,
                                          (ExprList *)0x0,0,(Expr *)0x0,(Expr *)0x0);
              local_100 = (Expr *)0x0;
            }
            else {
              local_f0 = (Select *)0x0;
            }
            uVar4 = (db->lookaside).bEnabled;
            (db->lookaside).bEnabled = '\0';
            local_68 = (ulong)uVar14;
            n = local_68 + 0x99;
            p = (Trigger *)sqlite3DbMallocRaw(db,n);
            if (p == (Trigger *)0x0) {
              pTVar16 = (TriggerStep *)0x0;
            }
            else {
              memset(p,0,n);
              pTVar16 = (TriggerStep *)(p + 1);
              p->step_list = pTVar16;
              p[1].pWhen = (Expr *)&p[2].table;
              *(uint *)&p[1].pColumns = uVar14;
              memcpy(&p[2].table,local_60,local_68);
              pSVar12 = (Schema *)exprDup(db,local_100,1,(u8 **)0x0);
              p[1].pSchema = pSVar12;
              pSVar12 = (Schema *)sqlite3ExprListDup(db,local_e8,1);
              p[1].pTabSchema = pSVar12;
              pSVar13 = sqlite3SelectDup(db,local_f0,1);
              *(Select **)&p[1].op = pSVar13;
              if (local_e0 == (Expr *)0x0) {
                local_e0 = (Expr *)0x0;
              }
              else {
                local_e0 = sqlite3PExpr(pParse,0x13,local_e0,(Expr *)0x0,(Token *)0x0);
                pEVar9 = exprDup(db,local_e0,1,(u8 **)0x0);
                p->pWhen = pEVar9;
              }
            }
            (db->lookaside).bEnabled = uVar4;
            sqlite3ExprDelete(db,local_100);
            sqlite3ExprDelete(db,local_e0);
            sqlite3ExprListDelete(db,local_e8);
            clearSelect(db,local_f0,1);
            if (db->mallocFailed != '\x01') {
              if (uVar2 == '\x06') {
                uVar5 = 0x77;
              }
              else if ((uVar2 == '\t') && (pChanges == (ExprList *)0x0)) {
                uVar5 = 0x6d;
              }
              else {
                uVar5 = 0x6e;
              }
              pTVar16->op = uVar5;
              pTVar16->pTrig = p;
              pSVar12 = pTab->pSchema;
              p->pSchema = pSVar12;
              p->pTabSchema = pSVar12;
              p_00->apTrigger[local_78] = p;
              p->op = (pChanges != (ExprList *)0x0) + 'm';
              aChange = local_80;
              goto LAB_0016882b;
            }
            fkTriggerDelete(db,p);
            aChange = local_80;
          }
        }
        else if (p != (Trigger *)0x0) {
LAB_0016882b:
          sqlite3CodeRowTriggerDirect(pParse,p,pTab,local_9c,2,0);
        }
      }
      p_00 = p_00->pNextTo;
    } while (p_00 != (FKey *)0x0);
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3FkActions(
  Parse *pParse,                  /* Parse context */
  Table *pTab,                    /* Table being updated or deleted from */
  ExprList *pChanges,             /* Change-list for UPDATE, NULL for DELETE */
  int regOld,                     /* Address of array containing old row */
  int *aChange,                   /* Array indicating UPDATEd columns (or 0) */
  int bChngRowid                  /* True if rowid is UPDATEd */
){
  /* If foreign-key support is enabled, iterate through all FKs that 
  ** refer to table pTab. If there is an action associated with the FK 
  ** for this operation (either update or delete), invoke the associated 
  ** trigger sub-program.  */
  if( pParse->db->flags&SQLITE_ForeignKeys ){
    FKey *pFKey;                  /* Iterator variable */
    for(pFKey = sqlite3FkReferences(pTab); pFKey; pFKey=pFKey->pNextTo){
      if( aChange==0 || fkParentIsModified(pTab, pFKey, aChange, bChngRowid) ){
        Trigger *pAct = fkActionTrigger(pParse, pTab, pFKey, pChanges);
        if( pAct ){
          sqlite3CodeRowTriggerDirect(pParse, pAct, pTab, regOld, OE_Abort, 0);
        }
      }
    }
  }
}